

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sophia_interface.cpp
# Opt level: O0

vector<int,_std::allocator<int>_> * __thiscall
sophia_interface::LUKFDI
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,sophia_interface *this,int KFL1
          ,int KFL2)

{
  bool bVar1;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  initializer_list<int> __l_01;
  initializer_list<int> __l_02;
  initializer_list<double> __l_03;
  int iVar2;
  int *piVar3;
  double *pdVar4;
  value_type_conflict1 vVar5;
  double dVar6;
  double dVar7;
  __type _Var8;
  double dVar9;
  allocator local_2d1;
  string local_2d0 [36];
  int local_2ac;
  int local_2a8;
  int KC;
  int sgn_11;
  int sgn_10;
  int KFLE_1;
  int local_294;
  iterator local_290;
  undefined8 local_288;
  int local_280;
  int local_27c;
  int KFLF_1;
  int local_274;
  iterator local_270;
  undefined8 local_268;
  int local_260;
  allocator local_259;
  int KFLD_1;
  int local_238;
  int local_234;
  int sgn_9;
  int sgn_8;
  int KFL3B;
  int KT3_1;
  int iStack_220;
  bool breakLoop;
  int KTS_1;
  int KTAB3;
  int KTABS;
  int KT3;
  int KTS;
  double RFL;
  int local_200;
  int KT3U;
  int KT3L;
  int sgn_7;
  int sgn_6;
  int KFLL;
  int KFLE;
  int local_1e4;
  iterator local_1e0;
  undefined8 local_1d8;
  int local_1d0;
  int local_1cc;
  int KFLF;
  int local_1c4;
  iterator local_1c0;
  undefined8 local_1b8;
  int local_1ac;
  double dStack_1a8;
  int KFLD;
  double WTDQ_1;
  uint local_198;
  int sgn_5;
  int sgn_4;
  int KBARY;
  double WT;
  int local_180;
  int sgn_3;
  int sgn_2;
  int IMIX;
  double RMIX;
  double RMUL;
  int KMUL;
  int sgn_1;
  double local_158;
  double local_150;
  double local_148;
  int local_140;
  int local_13c;
  int KFL1E;
  int KFL1D;
  int KFL1B_1;
  int KFL1A_1;
  int local_128;
  int local_124;
  int sgn;
  int KFLS;
  double WTDQ;
  int KFLDB;
  int KFLDA;
  int KFLDS;
  int KFDA;
  int MBARY;
  bool repeat110;
  double local_f8;
  double local_f0;
  iterator local_e8;
  undefined8 local_e0;
  double local_d8;
  double PARSM;
  double PARS2;
  double PARS1;
  double PARS0;
  double PARDM;
  double PAR4M;
  double PAR3M;
  double PAR4;
  double PAR3;
  double PAR2;
  int local_80;
  int iStack_7c;
  bool repeat100;
  int KFS;
  int KFLC;
  int KFLB;
  int KFLA;
  int KFL3A;
  int KFL2S;
  int KFL2B;
  int KFL2A;
  int KFL1S;
  int KFL1B;
  int KFL1A;
  int KTAB2;
  int KTAB1;
  bool skip;
  int local_34;
  int local_30;
  int KF2A;
  int KF1A;
  value_type_conflict1 local_24;
  int KF;
  int KFL3;
  int KFL2_local;
  int KFL1_local;
  sophia_interface *this_local;
  vector<int,_std::allocator<int>_> *output;
  
  local_24 = 0;
  KF1A = 0;
  KF2A._3_1_ = 0;
  KF = KFL2;
  KFL3 = KFL1;
  _KFL2_local = this;
  this_local = (sophia_interface *)__return_storage_ptr__;
  std::vector<int,_std::allocator<int>_>::vector(__return_storage_ptr__);
  local_30 = KFL3;
  if (KFL3 < 1) {
    local_30 = -KFL3;
  }
  local_34 = KF;
  if (KF < 1) {
    local_34 = -KF;
  }
  if (local_30 == 0) {
    std::vector<int,_std::allocator<int>_>::push_back(__return_storage_ptr__,&local_24);
    std::vector<int,_std::allocator<int>_>::push_back(__return_storage_ptr__,&KF1A);
    return __return_storage_ptr__;
  }
  if (local_34 != 0) {
    if (((local_30 < 0xb) && (local_34 < 0xb)) && (0 < KFL3 * KF)) {
      std::vector<int,_std::allocator<int>_>::push_back(__return_storage_ptr__,&local_24);
      std::vector<int,_std::allocator<int>_>::push_back(__return_storage_ptr__,&KF1A);
      return __return_storage_ptr__;
    }
    if ((10 < local_30) && (10 < local_34)) {
      std::vector<int,_std::allocator<int>_>::push_back(__return_storage_ptr__,&local_24);
      std::vector<int,_std::allocator<int>_>::push_back(__return_storage_ptr__,&KF1A);
      return __return_storage_ptr__;
    }
    if (((10 < local_30) || (10 < local_34)) && (KFL3 * KF < 0)) {
      std::vector<int,_std::allocator<int>_>::push_back(__return_storage_ptr__,&local_24);
      std::vector<int,_std::allocator<int>_>::push_back(__return_storage_ptr__,&KF1A);
      return __return_storage_ptr__;
    }
  }
  KTAB2._3_1_ = 0;
  KFL1A = 0;
  KFL1B = 0;
  KFL1S = 0;
  KFL2A = 0;
  if (MSTJ[0xe] == 1) {
    KFL1A = -1;
    if ((0 < local_30) && (local_30 < 7)) {
      KFL1A = local_30;
    }
    KFL1S = (int)((long)((ulong)(uint)((int)((long)local_30 / 1000) >> 0x1f) << 0x20 |
                        (long)local_30 / 1000 & 0xffffffffU) % 10);
    KFL2A = (int)((long)((ulong)(uint)((int)((long)local_30 / 100) >> 0x1f) << 0x20 |
                        (long)local_30 / 100 & 0xffffffffU) % 10);
    KFL2B = local_30 % 10;
    if ((((0 < KFL1S) && (KFL1S < 5)) && (0 < KFL2A)) && (KFL2A < 5)) {
      KFL1A = KFL1S * (KFL1S + -2) + 6 + KFL2A * 2 + (KFL2B + -1) / 2;
    }
    if (((0 < KFL1S) && (KFL1S < 5)) && (KFL1S == KFL2A)) {
      KFL1A = KFL1A + -1;
    }
    if ((0 < local_30) && (local_30 < 7)) {
      KFL1S = local_30;
    }
    KFL1B = 0;
    if (local_34 != 0) {
      KFL1B = -1;
      if ((0 < local_34) && (local_34 < 7)) {
        KFL1B = local_34;
      }
      KFL2S = (int)((long)((ulong)(uint)((int)((long)local_34 / 1000) >> 0x1f) << 0x20 |
                          (long)local_34 / 1000 & 0xffffffffU) % 10);
      KFL3A = (int)((long)((ulong)(uint)((int)((long)local_34 / 100) >> 0x1f) << 0x20 |
                          (long)local_34 / 100 & 0xffffffffU) % 10);
      KFLA = local_34 % 10;
      if ((((0 < KFL2S) && (KFL2S < 5)) && (0 < KFL3A)) && (KFL3A < 5)) {
        KFL1B = KFL2S * (KFL2S + -2) + 6 + KFL3A * 2 + (KFLA + -1) / 2;
      }
      if (((0 < KFL2S) && (KFL2S < 5)) && (KFL2S == KFL3A)) {
        KFL1B = KFL1B + -1;
      }
    }
    if ((-1 < KFL1A) && (-1 < KFL1B)) {
      KTAB2._3_1_ = 1;
    }
  }
  KFLB = 0;
  KFLC = 0;
  KFS = 0;
  iStack_7c = 0;
  local_80 = 0;
  while (PAR2._7_1_ = 0, (KTAB2._3_1_ & 1) != 0) {
    PAR2._7_1_ = 0;
    KTAB2._3_1_ = 0;
    local_200 = KFL1B;
    RFL._4_4_ = KFL1B;
    if ((KFL1B == 0) && (MSTJ[0xb] < 1)) {
      local_200 = 1;
      RFL._4_4_ = 6;
    }
    else if ((KFL1B == 0) && ((6 < KFL1A && (MSTJ[0xb] < 2)))) {
      local_200 = 1;
      RFL._4_4_ = 6;
    }
    else if (KFL1B == 0) {
      local_200 = 1;
      RFL._4_4_ = 0x16;
    }
    _KT3 = 0.0;
    for (KTABS = 0; KTABS < 3; KTABS = KTABS + 1) {
      for (KTAB3 = local_200; KTAB3 < RFL._4_4_ + 1; KTAB3 = KTAB3 + 1) {
        _KT3 = PARF[KFL1A * 0x50 + KTABS * 0x19 + KTAB3 + 0x77] + _KT3;
      }
    }
    dVar6 = RLU(this,false);
    _KT3 = dVar6 * _KT3;
    KTS_1 = 0;
    iStack_220 = 0;
    for (KT3_1 = 0; KT3_1 < 3; KT3_1 = KT3_1 + 1) {
      KTS_1 = KT3_1;
      KFL3B._3_1_ = '\0';
      for (sgn_8 = local_200; sgn_8 < RFL._4_4_ + 1; sgn_8 = sgn_8 + 1) {
        iStack_220 = sgn_8;
        _KT3 = _KT3 - PARF[KFL1A * 0x50 + KT3_1 * 0x19 + sgn_8 + 0x77];
        if (_KT3 <= 0.0) {
          KFL3B._3_1_ = '\x01';
          break;
        }
      }
      if (KFL3B._3_1_ != '\0') break;
    }
    if (iStack_220 < 7) {
      KFLB = iStack_220;
      sgn_9 = 0;
      local_234 = 1;
      if (KFL3 * (KFL1A * 2 + -0xd) < 0) {
        local_234 = -1;
      }
      local_24 = iStack_220 * local_234;
    }
    else {
      KFLB = 1;
      if (7 < iStack_220) {
        KFLB = 2;
      }
      if (10 < iStack_220) {
        KFLB = 3;
      }
      if (0xf < iStack_220) {
        KFLB = 4;
      }
      sgn_9 = ((iStack_220 + -6) - KFLB * (KFLB + -2)) / 2;
      iVar2 = KFLB * 1000 + sgn_9 * 100;
      local_24 = iVar2 + 1;
      if ((KFLB == sgn_9) || (iStack_220 != KFLB * (KFLB + -2) + 6 + sgn_9 * 2)) {
        local_24 = iVar2 + 3;
      }
      local_238 = 1;
      if (KFL3 * (KFL1A * -2 + 0xd) < 0) {
        local_238 = -1;
      }
      local_24 = local_24 * local_238;
    }
    if (((KFLB == KFL1S) && (sgn_9 == KFL2A)) && ((KFLB < 4 || (sgn_9 != 0)))) {
      _KT3 = RLU(this,false);
      _KT3 = _KT3 * (PARF[KFL1A * 0x50 + KTS_1 * 0x19 + 0x8e] +
                     PARF[KFL1A * 0x50 + KTS_1 * 0x19 + 0x8f] +
                    PARF[KFL1A * 0x50 + KTS_1 * 0x19 + 0x90]);
      KF1A = KTS_1 * 2 + 0x6f;
      if (PARF[KFL1A * 0x50 + KTS_1 * 0x19 + 0x8e] <= _KT3 &&
          _KT3 != PARF[KFL1A * 0x50 + KTS_1 * 0x19 + 0x8e]) {
        KF1A = KTS_1 * 2 + 0xdd;
      }
      if (PARF[KFL1A * 0x50 + KTS_1 * 0x19 + 0x8e] + PARF[KFL1A * 0x50 + KTS_1 * 0x19 + 0x8f] < _KT3
         ) {
        KF1A = KTS_1 * 2 + 0x14b;
      }
LAB_00149b7e:
      if (KF != 0) {
        local_24 = 0;
      }
      local_2ac = LUCOMP(this,KF1A);
      if (local_2ac == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_2d0,"LUKFDI: user-defined flavour probabilities failed",&local_2d1);
        LUERRM(this,2,(string *)local_2d0);
        std::__cxx11::string::~string(local_2d0);
        std::allocator<char>::~allocator((allocator<char> *)&local_2d1);
        PAR2._7_1_ = 1;
      }
    }
    else {
      if ((KFL1A < 7) && (iStack_220 < 7)) {
        piVar3 = std::max<int>(&KFL1A,&stack0xfffffffffffffde0);
        KFLC = *piVar3;
        piVar3 = std::min<int>(&KFL1A,&stack0xfffffffffffffde0);
        KFS = *piVar3;
        local_80 = 1;
        if (KFL3 < 0) {
          local_80 = -1;
        }
        if (KFLC != local_30) {
          local_80 = -local_80;
        }
        iVar2 = (KFLC * 100 + KFS * 10 + 1 + KTS_1 * 2) * local_80;
        _Var8 = std::pow<int,int>(-1,KFLC);
        KF1A = (int)((double)iVar2 * _Var8);
        goto LAB_00149b7e;
      }
      if ((KFL1A < 7) || (iStack_220 < 7)) {
        if (KFL1A < 7) {
          KFLC = KFL1S;
          KFS = KFLB;
          iStack_7c = sgn_9;
        }
        else {
          KFLC = KFLB;
          KFS = KFL1S;
          iStack_7c = KFL2A;
        }
        local_27c = KFLC;
        KFLF_1 = KFS;
        local_274 = iStack_7c;
        local_270 = &local_27c;
        local_268 = 3;
        __l_00._M_len = 3;
        __l_00._M_array = local_270;
        local_260 = std::max<int>(__l_00);
        sgn_10 = KFLC;
        KFLE_1 = KFS;
        local_294 = iStack_7c;
        local_290 = &sgn_10;
        local_288 = 3;
        __l._M_len = 3;
        __l._M_array = local_290;
        local_280 = std::min<int>(__l);
        sgn_11 = ((KFLC + KFS + iStack_7c) - local_260) - local_280;
        if (KTS_1 == 0) {
          KC = 1;
          if (KFL3 < 0) {
            KC = -1;
          }
          KF1A = (local_260 * 1000 + local_280 * 100 + sgn_11 * 10 + 2) * KC;
        }
        if (0 < KTS_1) {
          local_2a8 = 1;
          if (KFL3 < 0) {
            local_2a8 = -1;
          }
          KF1A = (local_260 * 1000 + sgn_11 * 100 + local_280 * 10 + KTS_1 * 2) * local_2a8;
        }
        goto LAB_00149b7e;
      }
      local_80 = 1;
      if (KFL3 < 0) {
        local_80 = -1;
      }
      if (KFL1S == KFLB) {
        piVar3 = std::max<int>(&KFL2A,&sgn_9);
        KFLC = *piVar3;
        piVar3 = std::min<int>(&KFL2A,&sgn_9);
        KFS = *piVar3;
        if (KFLC != KFL2A) {
          local_80 = -local_80;
        }
LAB_00149972:
        iVar2 = (KFLC * 100 + KFS * 10 + 1 + KTS_1 * 2) * local_80;
        _Var8 = std::pow<int,int>(-1,KFLC);
        KF1A = (int)((double)iVar2 * _Var8);
        goto LAB_00149b7e;
      }
      if (KFL1S == sgn_9) {
        KFLC = KFLB;
        KFS = KFL2A;
        local_80 = -local_80;
        goto LAB_00149972;
      }
      if (KFL2A == KFLB) {
        KFLC = KFL1S;
        KFS = sgn_9;
        goto LAB_00149972;
      }
      if (KFL2A == sgn_9) {
        piVar3 = std::max<int>(&KFL1S,&KFLB);
        KFLC = *piVar3;
        piVar3 = std::min<int>(&KFL1S,&KFLB);
        KFS = *piVar3;
        if (KFLC != KFL1S) {
          local_80 = -local_80;
        }
        goto LAB_00149972;
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&KFLD_1,"LUKFDI: no matching flavours for qq -> qq",&local_259);
      LUERRM(this,2,(string *)&KFLD_1);
      std::__cxx11::string::~string((string *)&KFLD_1);
      std::allocator<char>::~allocator((allocator<char> *)&local_259);
      PAR2._7_1_ = 1;
    }
    if ((PAR2._7_1_ & 1) == 0) {
      std::vector<int,_std::allocator<int>_>::push_back(__return_storage_ptr__,&local_24);
      std::vector<int,_std::allocator<int>_>::push_back(__return_storage_ptr__,&KF1A);
      return __return_storage_ptr__;
    }
  }
  PAR3 = PARJ[1];
  PAR4 = PARJ[2];
  PAR3M = PARJ[3] * 3.0;
  PAR4M = 0.0;
  PARDM = 0.0;
  PARS0 = 0.0;
  PARS1 = 0.0;
  PARS2 = 0.0;
  PARSM = 0.0;
  local_d8 = 0.0;
  if (1 < MSTJ[0xb]) {
    PAR4M = sqrt(PARJ[2]);
    dVar6 = sqrt(PARJ[3]);
    PARDM = 1.0 / (dVar6 * 3.0);
    PARS0 = PARJ[6] / (PAR4M * PARJ[5] + PARJ[6]);
    _MBARY = PARJ[4] * ((PAR3 * PAR4M * PARJ[6] + 1.0) * (PARDM + 1.0) + 2.0);
    local_f8 = PARJ[4] * (PARJ[5] * (PARDM + 1.0) + PAR3 * PAR4M * PARJ[5] * PARJ[6]) +
               (PARJ[6] * _MBARY) / (PAR4M + PAR4M);
    local_f0 = (PARJ[4] + PARJ[4]) * PARJ[5] * PARJ[6] * (PAR3 * PARJ[6] + (PARDM + 1.0) / PAR4M);
    local_e8 = (iterator)&MBARY;
    local_e0 = 3;
    __l_03._M_len = 3;
    __l_03._M_array = local_e8;
    PARSM = local_f0;
    PARS2 = local_f8;
    PARS1 = _MBARY;
    local_d8 = std::max<double>(__l_03);
    PAR3M = (PAR3M * (local_d8 + 1.0)) / (local_d8 / (PARDM * 3.0) + 1.0);
  }
  while( true ) {
    KFDA._3_1_ = 0;
    KFLDS = 0;
    KFLDA = 0;
    if (local_30 < 0xb) {
      if (((local_34 == 0) && (0 < MSTJ[0xb])) &&
         (dVar6 = PARJ[0] + 1.0, dVar7 = RLU(this,false), 1.0 < dVar6 * dVar7)) {
        KFLDS = 1;
      }
      if ((10 < local_34) && (KFLDS = 2, local_34 < 0x2711)) {
        KFLDA = local_34;
      }
    }
    else {
      KFLDS = 2;
      if (local_30 < 0x2711) {
        KFLDA = local_30;
      }
    }
    KFLDB = 0;
    if ((KFLDA != 0) && (1 < MSTJ[0xb])) {
      WTDQ._4_4_ = (KFLDA / 1000) % 10;
      WTDQ._0_4_ = (KFLDA / 100) % 10;
      KFLDB = KFLDA % 10;
      _sgn = PARS1;
      piVar3 = std::max<int>((int *)((long)&WTDQ + 4),(int *)&WTDQ);
      if (*piVar3 == 3) {
        _sgn = PARS2;
      }
      piVar3 = std::min<int>((int *)((long)&WTDQ + 4),(int *)&WTDQ);
      if (*piVar3 == 3) {
        _sgn = PARSM;
      }
      if (KFLDB == 1) {
        _sgn = _sgn / (PARDM * 3.0);
      }
      dVar6 = _sgn + 1.0;
      dVar7 = RLU(this,false);
      if (1.0 < dVar6 * dVar7) {
        KFLDS = -1;
      }
      if ((KFLDS == -1) && (local_34 != 0)) {
        std::vector<int,_std::allocator<int>_>::push_back(__return_storage_ptr__,&local_24);
        std::vector<int,_std::allocator<int>_>::push_back(__return_storage_ptr__,&KF1A);
        return __return_storage_ptr__;
      }
    }
    local_124 = 0;
    if (0 < KFLDS) break;
    local_80 = 1;
    if (KFL3 < 0) {
      local_80 = -1;
    }
    if (KFLDS == 0) {
      local_128 = 1;
      if (0 < KFL3) {
        local_128 = -1;
      }
      if (local_34 == 0) {
        dVar6 = PAR3 + 2.0;
        dVar7 = RLU(this,false);
        local_24 = ((int)(dVar6 * dVar7) + 1) * local_128;
      }
      vVar5 = local_24;
      if (local_24 < 1) {
        vVar5 = -local_24;
      }
      KFL1A_1 = local_34 + vVar5;
      piVar3 = std::max<int>(&local_30,&KFL1A_1);
      KFLC = *piVar3;
      vVar5 = local_24;
      if (local_24 < 1) {
        vVar5 = -local_24;
      }
      KFL1B_1 = local_34 + vVar5;
      piVar3 = std::min<int>(&local_30,&KFL1B_1);
      KFS = *piVar3;
      if (KFLC != local_30) {
        local_80 = -local_80;
      }
    }
    else {
      KFL1D = (int)((long)((ulong)(uint)((int)((long)local_30 / 1000) >> 0x1f) << 0x20 |
                          (long)local_30 / 1000 & 0xffffffffU) % 10);
      KFL1E = (int)((long)((ulong)(uint)((int)((long)local_30 / 100) >> 0x1f) << 0x20 |
                          (long)local_30 / 100 & 0xffffffffU) % 10);
      local_13c = 0;
      local_140 = 0;
      do {
        iVar2 = KFL1D;
        dVar6 = RLU(this,false);
        local_13c = iVar2 + (int)(dVar6 + 0.5) * (KFL1E - KFL1D);
        local_140 = (KFL1D + KFL1E) - local_13c;
        if (((local_13c == 3) && (dVar6 = RLU(this,false), PARS0 < dVar6)) ||
           ((local_140 == 3 && (dVar6 = RLU(this,false), dVar6 < PARS0)))) {
          local_13c = (KFL1D + KFL1E) - local_13c;
          local_140 = (KFL1D + KFL1E) - local_140;
        }
        dVar6 = PAR3 * PAR4M * PARJ[6];
        dVar7 = RLU(this,false);
        KFLB = (int)((dVar6 + 2.0) * dVar7) + 1;
        if (local_140 == KFLB) {
LAB_001481e8:
          bVar1 = false;
          if (local_140 == KFLB) {
            dVar6 = RLU(this,false);
            local_158 = 2.0;
            _KMUL = PARDM + 1.0;
            pdVar4 = std::max<double>(&local_158,(double *)&KMUL);
            bVar1 = 2.0 / *pdVar4 < dVar6;
          }
        }
        else {
          dVar6 = RLU(this,false);
          dVar7 = PARDM + 1.0;
          local_148 = 2.0;
          local_150 = PARDM + 1.0;
          pdVar4 = std::max<double>(&local_148,&local_150);
          bVar1 = true;
          if (dVar6 <= dVar7 / *pdVar4) goto LAB_001481e8;
        }
      } while (bVar1);
      KFLDB = 3;
      if (local_140 != KFLB) {
        dVar6 = RLU(this,false);
        KFLDB = (int)(dVar6 + 1.0 / (PARDM + 1.0)) * 2 + 1;
      }
      RMUL._4_4_ = -KFL3 >> 0x1f | 1;
      piVar3 = std::max<int>(&local_140,&KFLB);
      iVar2 = *piVar3;
      piVar3 = std::min<int>(&local_140,&KFLB);
      local_24 = (iVar2 * 1000 + 10000 + *piVar3 * 100 + KFLDB) * RMUL._4_4_;
      piVar3 = std::max<int>(&local_13c,&KFLB);
      KFLC = *piVar3;
      piVar3 = std::min<int>(&local_13c,&KFLB);
      KFS = *piVar3;
      if (KFLC != local_13c) {
        local_80 = -local_80;
      }
    }
    dVar6 = PARJ[10];
    RMUL._0_4_ = 0;
    if (KFLC < 3) {
      dVar7 = RLU(this,false);
      RMUL._0_4_ = (int)(dVar6 + dVar7);
    }
    dVar6 = PARJ[0xb];
    if (KFLC == 3) {
      dVar7 = RLU(this,false);
      RMUL._0_4_ = (int)(dVar6 + dVar7);
    }
    dVar6 = PARJ[0xc];
    if (3 < KFLC) {
      dVar7 = RLU(this,false);
      RMUL._0_4_ = (int)(dVar6 + dVar7);
    }
    if ((RMUL._0_4_ != 0) || (PARJ[0xd] <= 0.0)) {
      if ((RMUL._0_4_ == 1) && (0.0 < PARJ[0xe] + PARJ[0xf] + PARJ[0x10])) {
        RMIX = RLU(this,false);
        if (RMIX < PARJ[0xe]) {
          RMUL._0_4_ = 3;
        }
        if ((RMUL._0_4_ == 1) && (RMIX < PARJ[0xe] + PARJ[0xf])) {
          RMUL._0_4_ = 4;
        }
        if ((RMUL._0_4_ == 1) && (RMIX < PARJ[0xe] + PARJ[0xf] + PARJ[0x10])) {
          RMUL._0_4_ = 5;
        }
      }
    }
    else {
      dVar6 = RLU(this,false);
      if (dVar6 < PARJ[0xd]) {
        RMUL._0_4_ = 2;
      }
    }
    local_124 = 3;
    if ((RMUL._0_4_ == 0) || (RMUL._0_4_ == 3)) {
      local_124 = 1;
    }
    if (RMUL._0_4_ == 5) {
      local_124 = 5;
    }
    if (KFLC == KFS) {
      _sgn_2 = RLU(this,false);
      sgn_3 = KFLC * 2 + RMUL._0_4_ * 10;
      iVar2 = KFLC;
      if (KFLC < 4) {
        iVar2 = (int)(_sgn_2 + PARF[sgn_3 + -2]) + 1 + (int)(_sgn_2 + PARF[sgn_3 + -1]);
      }
      KF1A = iVar2 * 0x6e + local_124;
    }
    else {
      iVar2 = (KFLC * 100 + KFS * 10 + local_124) * local_80;
      _Var8 = std::pow<int,int>(-1,KFLC);
      KF1A = (int)((double)iVar2 * _Var8);
    }
    if ((RMUL._0_4_ == 2) || (RMUL._0_4_ == 3)) {
      local_180 = 1;
      if (KF1A < 0) {
        local_180 = -1;
      }
      KF1A = local_180 * 10000 + KF1A;
    }
    if (RMUL._0_4_ == 4) {
      WT._4_4_ = 1;
      if (KF1A < 0) {
        WT._4_4_ = -1;
      }
      KF1A = WT._4_4_ * 20000 + KF1A;
    }
    if (KF1A == 0xdd) {
      dVar6 = RLU(this,false);
      if (dVar6 <= PARJ[0x18]) goto LAB_00149156;
    }
    else if ((KF1A != 0x14b) || (dVar6 = RLU(this,false), dVar6 <= PARJ[0x19])) goto LAB_00149156;
  }
  _sgn_4 = 0.0;
  sgn_5 = 0;
  do {
    if ((local_30 < 0xb) && (local_34 == 0)) {
      KFLC = local_30;
      do {
        dVar6 = PAR3 * PAR4;
        dVar7 = RLU(this,false);
        KFS = (int)((dVar6 + 2.0) * dVar7) + 1;
        dVar7 = PAR3 * PAR4;
        dVar9 = RLU(this,false);
        dVar6 = PAR3M;
        iStack_7c = (int)((dVar7 + 2.0) * dVar9) + 1;
        KFLDB = 1;
        if (iStack_7c <= KFS) {
          KFLDB = 3;
        }
        if (KFLDB == 1) {
          dVar7 = RLU(this,false);
          bVar1 = true;
          if (dVar6 * dVar7 <= 1.0) goto LAB_00148a10;
        }
        else {
LAB_00148a10:
          dVar6 = PAR3M;
          bVar1 = false;
          if (KFLDB == 3) {
            dVar7 = RLU(this,false);
            bVar1 = dVar6 < dVar7;
          }
        }
      } while (bVar1);
      local_198 = KFL3 >> 0x1f | 1;
      piVar3 = std::max<int>(&KFS,&stack0xffffffffffffff84);
      iVar2 = *piVar3;
      piVar3 = std::min<int>(&KFS,&stack0xffffffffffffff84);
      local_24 = (iVar2 * 1000 + *piVar3 * 100 + KFLDB) * local_198;
    }
    else {
      if (local_30 < 0xb) {
        KFLC = local_30;
        KFS = (int)((long)((ulong)(uint)((int)((long)local_34 / 1000) >> 0x1f) << 0x20 |
                          (long)local_34 / 1000 & 0xffffffffU) % 10);
        iStack_7c = (int)((long)((ulong)(uint)((int)((long)local_34 / 100) >> 0x1f) << 0x20 |
                                (long)local_34 / 100 & 0xffffffffU) % 10);
        iVar2 = local_34;
      }
      else {
        if (local_34 == 0) {
          WTDQ_1._4_4_ = KFL3 >> 0x1f | 1;
          dVar6 = PAR3 + 2.0;
          dVar7 = RLU(this,false);
          local_24 = ((int)(dVar6 * dVar7) + 1) * WTDQ_1._4_4_;
        }
        vVar5 = local_24;
        if (local_24 < 1) {
          vVar5 = -local_24;
        }
        KFLC = local_34 + vVar5;
        KFS = (int)((long)((ulong)(uint)((int)((long)local_30 / 1000) >> 0x1f) << 0x20 |
                          (long)local_30 / 1000 & 0xffffffffU) % 10);
        iStack_7c = (int)((long)((ulong)(uint)((int)((long)local_30 / 100) >> 0x1f) << 0x20 |
                                (long)local_30 / 100 & 0xffffffffU) % 10);
        iVar2 = local_30;
      }
      KFLDB = iVar2 % 10;
    }
    sgn_5 = KFLDB;
    if ((KFLDB == 3) && (KFS != iStack_7c)) {
      sgn_5 = 5;
    }
    if ((KFLC != KFS) && (KFLC != iStack_7c)) {
      sgn_5 = sgn_5 + 1;
    }
    _sgn_4 = PARJ[0x11] * PARF[sgn_5 + 0x45] + PARF[sgn_5 + 0x3b];
    if ((KFLDS == 1) && (1 < MSTJ[0xb])) {
      dStack_1a8 = PARS1;
      piVar3 = std::max<int>(&KFS,&stack0xffffffffffffff84);
      if (*piVar3 == 3) {
        dStack_1a8 = PARS2;
      }
      piVar3 = std::min<int>(&KFS,&stack0xffffffffffffff84);
      if (*piVar3 == 3) {
        dStack_1a8 = PARSM;
      }
      if (KFLDB == 1) {
        dStack_1a8 = dStack_1a8 / (PARDM * 3.0);
        _sgn_4 = (_sgn_4 * (dStack_1a8 + 1.0)) / (local_d8 / (PARDM * 3.0) + 1.0);
      }
      if (KFLDB == 3) {
        _sgn_4 = (_sgn_4 * (dStack_1a8 + 1.0)) / (local_d8 + 1.0);
      }
    }
    dVar6 = _sgn_4;
    bVar1 = false;
    if (local_34 == 0) {
      dVar7 = RLU(this,false);
      bVar1 = dVar6 < dVar7;
    }
  } while (bVar1);
  local_1cc = KFLC;
  KFLF = KFS;
  local_1c4 = iStack_7c;
  local_1c0 = &local_1cc;
  local_1b8 = 3;
  __l_02._M_len = 3;
  __l_02._M_array = local_1c0;
  local_1ac = std::max<int>(__l_02);
  KFLL = KFLC;
  KFLE = KFS;
  local_1e4 = iStack_7c;
  local_1e0 = &KFLL;
  local_1d8 = 3;
  __l_01._M_len = 3;
  __l_01._M_array = local_1e0;
  local_1d0 = std::min<int>(__l_01);
  sgn_6 = ((KFLC + KFS + iStack_7c) - local_1ac) - local_1d0;
  local_124 = 2;
  dVar6 = PARF[(long)sgn_5 + 0x3b];
  dVar7 = PARJ[0x11] * PARF[(long)sgn_5 + 0x45];
  dVar9 = RLU(this,false);
  dVar9 = (dVar7 + dVar6) * dVar9;
  if (PARF[sgn_5 + 0x3b] <= dVar9 && dVar9 != PARF[sgn_5 + 0x3b]) {
    local_124 = 4;
  }
  sgn_7 = 0;
  if (((local_124 == 2) && (sgn_6 < local_1ac)) && (local_1d0 < sgn_6)) {
    if ((KFLDB == 1) && (KFLC == local_1ac)) {
      sgn_7 = 1;
    }
    if ((KFLDB == 1) && (KFLC != local_1ac)) {
      dVar6 = RLU(this,false);
      sgn_7 = (int)(dVar6 + 0.25);
    }
    if ((KFLDB == 3) && (KFLC != local_1ac)) {
      dVar6 = RLU(this,false);
      sgn_7 = (int)(dVar6 + 0.75);
    }
  }
  if (sgn_7 == 0) {
    KT3L = 1;
    if (KFL3 < 0) {
      KT3L = -1;
    }
    KF1A = (local_1ac * 1000 + sgn_6 * 100 + local_1d0 * 10 + local_124) * KT3L;
  }
  if (sgn_7 == 1) {
    KT3U = 1;
    if (KFL3 < 0) {
      KT3U = -1;
    }
    KF1A = (local_1ac * 1000 + local_1d0 * 100 + sgn_6 * 10 + local_124) * KT3U;
  }
LAB_00149156:
  std::vector<int,_std::allocator<int>_>::push_back(__return_storage_ptr__,&local_24);
  std::vector<int,_std::allocator<int>_>::push_back(__return_storage_ptr__,&KF1A);
  return __return_storage_ptr__;
}

Assistant:

std::vector<int> sophia_interface::LUKFDI(int KFL1, int KFL2) {
// Purpose: to generate a new flavour pair and combine off a hadron.
// Default flavour values. Input consistency checks.
// Returns vector (KFL3, KF).
    int KFL3 = 0;
    int KF = 0;
    std::vector<int> output;
    int KF1A = std::abs(KFL1);
    int KF2A = std::abs(KFL2);
    if (KF1A == 0) {output.push_back(KFL3); output.push_back(KF); return output;}
    if (KF2A != 0) {
        if (KF1A <= 10 && KF2A <= 10 && KFL1 * KFL2 > 0) {output.push_back(KFL3); output.push_back(KF); return output;}
        if (KF1A > 10 && KF2A > 10) {output.push_back(KFL3); output.push_back(KF); return output;}
        if ((KF1A > 10 || KF2A > 10) && KFL1 * KFL2 < 0) {output.push_back(KFL3); output.push_back(KF); return output;}
    }

    // Check if tabulated flavour probabilities are to be used. 
    bool skip = false;
    int KTAB1 = 0;
    int KTAB2 = 0;
    int KFL1A = 0;
    int KFL1B = 0;
    if (MSTJ[14] == 1) {
        KTAB1 = -1;
        if ((KF1A >= 1) && (KF1A <= 6)) KTAB1 = KF1A;
        KFL1A = (KF1A / 1000) % 10;
        KFL1B = (KF1A / 100) % 10;
        int KFL1S = KF1A % 10;
        if (KFL1A >= 1 && KFL1A <= 4 && KFL1B >= 1 && KFL1B <= 4) KTAB1 = 6 + KFL1A * (KFL1A - 2) + 2 * KFL1B + (KFL1S - 1) / 2;
        if (KFL1A >= 1 && KFL1A <= 4 && KFL1A == KFL1B) KTAB1--;
        if (KF1A >= 1 && KF1A <= 6) KFL1A = KF1A;
        KTAB2 = 0;
        if (KF2A != 0) {
            KTAB2 = -1;
            if (KF2A >= 1 && KF2A <= 6) KTAB2 = KF2A;
            int KFL2A = (KF2A / 1000) % 10;
            int KFL2B = (KF2A / 100) % 10;
            int KFL2S = KF2A % 10;
            if (KFL2A >= 1 && KFL2A <= 4 && KFL2B >= 1 && KFL2B <= 4) KTAB2 = 6 + KFL2A * (KFL2A - 2) + 2 * KFL2B + (KFL2S - 1) / 2;
            if (KFL2A >= 1 && KFL2A <= 4 && KFL2A == KFL2B) KTAB2--;
        }
        if (KTAB1 >= 0 && KTAB2 >= 0) skip = true;
    }

    // Parameters and breaking diquark parameter combinations.
    int KFL3A = 0;
    int KFLA = 0;
    int KFLB = 0;
    int KFLC = 0; 
    int KFS = 0;       
    bool repeat100 = false;
    do {
        repeat100 = false;
        if (skip == false) {
            double PAR2 = PARJ[1];
            double PAR3 = PARJ[2];
            double PAR4 = 3. * PARJ[3];
            double PAR3M = 0.;
            double PAR4M = 0.;
            double PARDM = 0.;
            double PARS0 = 0.;
            double PARS1 = 0.;
            double PARS2 = 0.;
            double PARSM = 0.;
            if (MSTJ[11] >= 2) {
                PAR3M = std::sqrt(PARJ[2]);
                PAR4M = 1. / (3. * std::sqrt(PARJ[3]));
                PARDM = PARJ[6] / (PARJ[6] + PAR3M * PARJ[5]);
                PARS0 = PARJ[4] * (2. + (1. + PAR2 * PAR3M * PARJ[6]) * (1. + PAR4M));
                PARS1 = PARJ[6] * PARS0 / (2. * PAR3M) + PARJ[4] * (PARJ[5] * (1. + PAR4M) + PAR2 * PAR3M * PARJ[5] * PARJ[6]);
                PARS2 = PARJ[4] * 2. * PARJ[5] * PARJ[6] * (PAR2 * PARJ[6] + (1. + PAR4M) / PAR3M);
                PARSM = std::max({PARS0, PARS1, PARS2});
                PAR4 = PAR4 * (1. + PARSM) / (1. + PARSM / (3. * PAR4M));
            }
     
            // Choice of whether to generate meson or baryon. 
            bool repeat110 = false;
            do {
                repeat110 = false;
                int MBARY = 0;
                int KFDA = 0;
                if (KF1A <= 10) {
                    if (KF2A == 0 && MSTJ[11] >= 1 && ((1. + PARJ[0]) * RLU()) > 1.) MBARY = 1;
                    if (KF2A > 10) MBARY = 2;
                    if (KF2A > 10 && KF2A <= 10000) KFDA = KF2A;
                } else {
                    MBARY = 2;
                    if (KF1A <= 10000) KFDA = KF1A;
                }

                // Possibility of process diquark -> meson + new diquark. 
                int KFLDS = 0;     
                if (KFDA != 0 && MSTJ[11] >= 2) {
                    int KFLDA = (KFDA / 1000) % 10;
                    int KFLDB = (KFDA / 100) % 10;
                    KFLDS = KFDA % 10;
                    double WTDQ = PARS0;
                    if (std::max(KFLDA, KFLDB) == 3) WTDQ = PARS1;
                    if (std::min(KFLDA, KFLDB) == 3) WTDQ = PARS2;
                    if (KFLDS == 1) WTDQ /= (3. * PAR4M);
                    if ((1. + WTDQ) * RLU() > 1.) MBARY = -1;
                    if (MBARY == -1 && KF2A != 0) {output.push_back(KFL3); output.push_back(KF); return output;}
                }
         
                // Flavour for meson, possibly with new flavour. 
                int KFLS = 0;
                if (MBARY <= 0) {
                    KFS = (KFL1 < 0)? -1 : 1;
                    if (MBARY == 0) {
                        int sgn = (-KFL1 < 0)? -1 : 1;
                        if (KF2A == 0) KFL3 = (1 + static_cast<int>((2. + PAR2) * RLU())) * sgn;
                        KFLA = std::max(KF1A, KF2A + std::abs(KFL3));
                        KFLB = std::min(KF1A, KF2A + std::abs(KFL3));
                        if (KFLA != KF1A) KFS = -KFS;
         
                    // Splitting of diquark into meson plus new diquark. 
                    } else {
                        int KFL1A = (KF1A / 1000) % 10;
                        int KFL1B = (KF1A / 100) % 10;
                        int KFL1D = 0;
                        int KFL1E = 0;
                        do {
                            KFL1D =  KFL1A + static_cast<int>(RLU() + 0.5) * (KFL1B - KFL1A);
                            KFL1E =  KFL1A + KFL1B - KFL1D;
                            if ((KFL1D == 3 && RLU() > PARDM) || (KFL1E == 3 && RLU() < PARDM)) {
                                KFL1D = KFL1A + KFL1B - KFL1D;
                                KFL1E = KFL1A + KFL1B - KFL1E;
                            }
                            KFL3A = 1 + static_cast<int>((2. + PAR2 * PAR3M * PARJ[6]) * RLU());
                        } while ((KFL1E != KFL3A && (RLU() > (1. + PAR4M) / std::max(2., 1. + PAR4M))) || (KFL1E == KFL3A && (RLU() > 2. / std::max(2., 1. + PAR4M))));
                        KFLDS = 3;
                        if (KFL1E != KFL3A) KFLDS = 2 * static_cast<int>(RLU() + 1. / (1. + PAR4M)) + 1;
                        int sgn = (-KFL1 < 0)? -1 : 1;
                        KFL3 = (10000 + 1000 * std::max(KFL1E, KFL3A) + 100 * std::min(KFL1E, KFL3A) + KFLDS) * sgn;
                        KFLA = std::max(KFL1D, KFL3A);
                        KFLB = std::min(KFL1D, KFL3A);
                        if (KFLA != KFL1D) KFS = -KFS;
                    }
         
                    // Form meson, with spin and flavour mixing for diagonal states. 
                    int KMUL = 0;
                    if (KFLA <= 2) KMUL = static_cast<int>(PARJ[10] + RLU());
                    if (KFLA == 3) KMUL = static_cast<int>(PARJ[11] + RLU());
                    if (KFLA >= 4) KMUL = static_cast<int>(PARJ[12] + RLU());
                    if (KMUL == 0 && PARJ[13] > 0.) {
                        if (RLU() < PARJ[13]) KMUL = 2;
                    } else if (KMUL == 1 && PARJ[14] + PARJ[15] + PARJ[16] > 0.) {
                        double RMUL = RLU();
                        if (RMUL < PARJ[14]) KMUL = 3;
                        if (KMUL == 1 && RMUL < PARJ[14] + PARJ[15]) KMUL = 4;
                        if (KMUL == 1 && RMUL < PARJ[14] + PARJ[15] + PARJ[16]) KMUL = 5;
                    }
                    KFLS = 3;
                    if (KMUL == 0 || KMUL == 3) KFLS = 1;
                    if (KMUL == 5) KFLS = 5;
                    if (KFLA != KFLB) {
                        KF = (100 * KFLA + 10 * KFLB + KFLS) * KFS * std::pow(-1, KFLA);
                    } else {
                        double RMIX = RLU();
                        int IMIX = 2 * KFLA + 10 * KMUL;
                        if (KFLA <= 3) KF = 110 * (1 + static_cast<int>(RMIX + PARF[IMIX - 2]) + static_cast<int>(RMIX + PARF[IMIX - 1])) + KFLS;
                        if (KFLA >= 4) KF = 110 * KFLA + KFLS;
                    }
                    if (KMUL == 2 || KMUL == 3) {
                        int sgn = (KF < 0)? -1 : 1;
                        KF += 10000 * sgn;
                    }
                    if (KMUL == 4) {
                        int sgn = (KF < 0)? -1 : 1;
                        KF += 20000 * sgn;
                    }

                    // Optional extra suppression of eta and eta'.
                    if (KF == 221) {
                        if (RLU() > PARJ[24]) {repeat110 = true; continue;}
                    } else if (KF == 331) {
                        if (RLU() > PARJ[25]) {repeat110 = true; continue;}
                    }

                // Generate diquark flavour.
                } else {
                    double WT = 0.;
                    int KBARY = 0.;
                    do {
                        if (KF1A <= 10 && KF2A == 0) {
                            KFLA = KF1A;
                            do {
                                KFLB = 1 + static_cast<int>((2. + PAR2 * PAR3) * RLU());
                                KFLC = 1 + static_cast<int>((2. + PAR2 * PAR3) * RLU());
                                KFLDS = 1;
                                if (KFLB >= KFLC) KFLDS = 3;
                            } while ((KFLDS == 1 && PAR4 * RLU() > 1.) || (KFLDS == 3 && PAR4 < RLU()));
                            int sgn = (KFL1 < 0)? -1 : 1;
                            KFL3 = (1000 * std::max(KFLB, KFLC) + 100 * std::min(KFLB, KFLC) + KFLDS) * sgn;

                        // Take diquark flavour from input. 
                        } else if (KF1A <= 10) {
                            KFLA = KF1A;
                            KFLB = (KF2A / 1000) % 10;
                            KFLC = (KF2A / 100) % 10;
                            KFLDS = KF2A % 10;

                        // Generate (or take from input) quark to go with diquark. 
                        } else {
                            if (KF2A == 0) {
                                int sgn = (KFL1 < 0)? -1 : 1;
                                KFL3 = (1 + static_cast<int>((2. + PAR2) * RLU())) * sgn;
                            }
                            KFLA = KF2A + std::abs(KFL3);
                            KFLB = (KF1A / 1000) % 10;
                            KFLC = (KF1A / 100) % 10;
                            KFLDS = KF1A % 10;
                        }

                        // SU(6) factors for formation of baryon. Try again if fails. 
                        KBARY = KFLDS;
                        if (KFLDS == 3 && KFLB != KFLC) KBARY = 5;
                        if (KFLA != KFLB && KFLA != KFLC) KBARY++;
                        WT = PARF[59 + KBARY] + PARJ[17] * PARF[69 + KBARY];
                        if (MBARY == 1 && MSTJ[11] >= 2) {
                            double WTDQ = PARS0;
                            if (std::max(KFLB, KFLC) == 3) WTDQ = PARS1;
                            if (std::min(KFLB, KFLC) == 3) WTDQ = PARS2;
                            if (KFLDS == 1) WTDQ /= (3. * PAR4M);
                            if (KFLDS == 1) WT = WT * (1. + WTDQ) / (1. + PARSM / (3. * PAR4M));
                            if (KFLDS == 3) WT = WT * (1. + WTDQ) / (1. + PARSM);
                        }
                    } while (KF2A == 0 && WT < RLU());

                    // Form baryon. Distinguish Lambda- and Sigmalike baryons. 
                    int KFLD = std::max({KFLA, KFLB, KFLC});
                    int KFLF = std::min({KFLA, KFLB, KFLC});
                    int KFLE = KFLA + KFLB + KFLC - KFLD - KFLF;
                    KFLS = 2;
                    if ((PARF[59 + KBARY] + PARJ[17] * PARF[69 + KBARY]) * RLU() > PARF[59 + KBARY]) KFLS = 4;
                    int KFLL = 0;
                    if (KFLS == 2 && KFLD > KFLE && KFLE > KFLF) {
                        if (KFLDS == 1 && KFLA == KFLD) KFLL = 1;
                        if (KFLDS == 1 && KFLA != KFLD) KFLL = static_cast<int>(0.25 + RLU());
                        if (KFLDS == 3 && KFLA != KFLD) KFLL = static_cast<int>(0.75 + RLU());
                    }
                    if (KFLL == 0) {
                        int sgn = (KFL1 < 0)? -1 : 1;
                        KF = (1000 * KFLD + 100 * KFLE + 10 * KFLF + KFLS) * sgn;
                    }
                    if (KFLL == 1) {
                        int sgn = (KFL1 < 0)? -1 : 1;
                        KF = (1000 * KFLD + 100 * KFLF + 10 * KFLE + KFLS) * sgn;
                    }
                }

                output.push_back(KFL3);
                output.push_back(KF);
                return output;
            } while (repeat110);
        }  // end skip condition
        skip = false;

        // Use tabulated probabilities to select new flavour and hadron.
        int KT3L = KTAB2;
        int KT3U = KTAB2;
        if (KTAB2 == 0 && MSTJ[11] <= 0) {
            KT3L = 1;
            KT3U = 6;
        } else if (KTAB2 == 0 && KTAB1 >= 7 && MSTJ[11] <= 1) {
            KT3L = 1;
            KT3U = 6;
        } else if (KTAB2 == 0) {
            KT3L = 1;
            KT3U = 22;
        }
        double RFL = 0.;
        for (int KTS = 0; KTS < 3; ++KTS) {
            for (int KT3 = KT3L; KT3 < KT3U + 1; ++KT3) {
                RFL += PARF[120 + 80 * KTAB1 + 25 * KTS + KT3 - 1];
            }
        }
        RFL *= RLU();
        int KTABS = 0;
        int KTAB3 = 0;
        for (int KTS = 0; KTS < 3; ++KTS) {
            KTABS = KTS;
            bool breakLoop = false;
            for (int KT3 = KT3L; KT3 < KT3U + 1; ++KT3) {
                KTAB3 = KT3;
                RFL -= PARF[120 + 80 * KTAB1 + 25 * KTS + KT3 - 1];
                if (RFL <= 0.) {breakLoop = true; break;}
            }
            if (breakLoop) break;
        }

        // Reconstruct flavour of produced quark/diquark.
        int KFL3B = 0;
        if (KTAB3 <= 6) {
            KFL3A = KTAB3;
            KFL3B = 0;
            int sgn = (KFL1 * (2 * KTAB1 - 13) < 0)? -1 : 1;
            KFL3 = KFL3A * sgn;
        } else {
            KFL3A = 1;
            if (KTAB3 >= 8) KFL3A = 2;
            if (KTAB3 >= 11) KFL3A = 3;
            if (KTAB3 >= 16) KFL3A = 4;
            KFL3B = (KTAB3 - 6 - KFL3A * (KFL3A - 2)) / 2;
            KFL3 = 1000 * KFL3A + 100 * KFL3B + 1;
            if (KFL3A == KFL3B || KTAB3 != 6 + KFL3A * (KFL3A - 2) + 2 * KFL3B) KFL3 += 2;
            int sgn = (KFL1 * (13 - 2 * KTAB1) < 0)? -1 : 1;
            KFL3 = KFL3 * sgn;
        }

        // Reconstruct meson code. 
        if (KFL3A == KFL1A && KFL3B == KFL1B && (KFL3A <= 3 || KFL3B != 0)) {
            RFL = RLU() * (PARF[143 + 80 * KTAB1 + 25 * KTABS - 1] + PARF[144 + 80 * KTAB1 + 25 * KTABS -1] + PARF[145 + 80 * KTAB1 + 25 * KTABS - 1]);
            KF = 110 + 2 * KTABS + 1;
            if (RFL > PARF[143 + 80 * KTAB1 + 25 * KTABS - 1]) KF = 220 + 2 * KTABS + 1;
            if (RFL > PARF[143 + 80 * KTAB1 + 25 * KTABS - 1] + PARF[144 + 80 * KTAB1 + 25 * KTABS - 1]) KF = 330 + 2 * KTABS + 1;
        } else if (KTAB1 <= 6 && KTAB3 <= 6) {
            KFLA = std::max(KTAB1, KTAB3);
            KFLB = std::min(KTAB1, KTAB3);
            KFS = (KFL1 < 0)? -1 : 1;
            if (KFLA != KF1A) KFS = -KFS;
            KF = (100 * KFLA + 10 * KFLB + 2 * KTABS + 1) * KFS * std::pow(-1, KFLA);
        } else if (KTAB1 >= 7 && KTAB3 >= 7) {
            KFS = (KFL1 < 0)? -1 : 1;
            if (KFL1A == KFL3A) {
                KFLA = std::max(KFL1B, KFL3B);
                KFLB = std::min(KFL1B, KFL3B);
                if (KFLA != KFL1B) KFS = -KFS;
            } else if (KFL1A == KFL3B) {
                KFLA = KFL3A;
                KFLB = KFL1B;
                KFS = -KFS;
            } else if (KFL1B == KFL3A) {
                KFLA = KFL1A;
                KFLB = KFL3B;
            } else if (KFL1B == KFL3B) {
                KFLA = std::max(KFL1A, KFL3A);
                KFLB = std::min(KFL1A, KFL3A);
                if (KFLA != KFL1A) KFS = -KFS;
            } else {
                LUERRM(2, "LUKFDI: no matching flavours for qq -> qq");
                repeat100 = true;
                continue;
            } 
            KF = (100 * KFLA + 10 * KFLB + 2 * KTABS + 1) * KFS * std::pow(-1, KFLA);

        // Reconstruct baryon code.
        } else {
            if (KTAB1 >= 7) {
                KFLA = KFL3A;
                KFLB = KFL1A;
                KFLC = KFL1B;
            } else {
                KFLA = KFL1A;
                KFLB = KFL3A;
                KFLC = KFL3B;
            }
            int KFLD = std::max({KFLA, KFLB, KFLC});
            int KFLF = std::min({KFLA, KFLB, KFLC});
            int KFLE = KFLA + KFLB + KFLC - KFLD - KFLF;
            if (KTABS == 0) {
                int sgn = (KFL1 < 0)? -1 : 1;
                KF = (1000 * KFLD + 100 * KFLF + 10 * KFLE + 2) * sgn;
            }
            if (KTABS >= 1) {
                int sgn = (KFL1 < 0)? -1 : 1;
                KF = (1000 * KFLD + 100 * KFLE + 10 * KFLF + 2 * KTABS) * sgn;
            }
        }

        // Check that constructed flavour code is an allowed one.
        if (KFL2 != 0) KFL3 = 0;
        int KC = LUCOMP(KF);
        if (KC == 0) {
            LUERRM(2, "LUKFDI: user-defined flavour probabilities failed");
            repeat100 = true;
            continue;
        }
    } while (repeat100);
    
    output.push_back(KFL3);
    output.push_back(KF);
    return output;
}